

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

MessageSizeCounts
capnp::_::WireHelpers::totalSize(SegmentReader *segment,WirePointer *ref,int nestingLimit)

{
  WirePointer *pWVar1;
  ushort uVar2;
  word *pwVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar6;
  long lVar7;
  Exception *pEVar8;
  WirePointer *pWVar9;
  DebugComparison<int_&,_int> *this;
  DebugComparison<int_&,_int> *pDVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  Array<char> *pAVar15;
  uint uVar16;
  ulong uVar17;
  Array<char> *pAVar18;
  WirePointer *pWVar19;
  Array<char> *pAVar20;
  bool bVar21;
  MessageSizeCounts MVar22;
  Fault f;
  SegmentReader *segment_local;
  int nestingLimit_local;
  DebugComparison<int_&,_int> _kjCondition;
  Iterator __end7;
  WordCountN<29> wordCount;
  Fault f_3;
  
  this = (DebugComparison<int_&,_int> *)&f;
  pDVar10 = (DebugComparison<int_&,_int> *)&f;
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    _kjCondition.left = &nestingLimit_local;
    _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
    _kjCondition.op.content.ptr = " > ";
    _kjCondition.op.content.size_ = 4;
    _kjCondition.result = 0 < nestingLimit;
    segment_local = segment;
    if (nestingLimit < 1) {
      nestingLimit_local = nestingLimit;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[30]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x312,FAILED,"nestingLimit > 0","_kjCondition,\"Message is too deeply-nested.\"",
                 &_kjCondition,(char (*) [30])"Message is too deeply-nested.");
    }
    else {
      nestingLimit_local = nestingLimit + -1;
      pWVar19 = ref + 1;
      lVar7 = (long)((int)(ref->offsetAndKind).value >> 2);
      if (segment == (SegmentReader *)0x0) {
        pWVar9 = pWVar19 + lVar7;
      }
      else {
        pwVar3 = (segment->ptr).ptr;
        pWVar9 = (WirePointer *)(pwVar3 + (segment->ptr).size_);
        if (((long)pwVar3 - (long)pWVar19 >> 3 <= lVar7) &&
           (lVar7 <= (long)pWVar9 - (long)pWVar19 >> 3)) {
          pWVar9 = pWVar19 + lVar7;
        }
      }
      pWVar19 = ref;
      if ((segment != (SegmentReader *)0x0) && (((ref->offsetAndKind).value & 3) == 2)) {
        iVar4 = (*segment->arena->_vptr_Arena[2])(segment->arena,(ulong)(ref->field_1).upper32Bits);
        segment_local = (SegmentReader *)CONCAT44(extraout_var,iVar4);
        _kjCondition.left = (int *)&segment_local;
        _kjCondition.right = 0;
        _kjCondition._12_4_ = 0;
        _kjCondition.op.content.ptr = " != ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = segment_local != (SegmentReader *)0x0;
        if (segment_local == (SegmentReader *)0x0) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x244,FAILED,"segment != nullptr",
                     "_kjCondition,\"Message contains far pointer to unknown segment.\"",
                     (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                     (char (*) [49])"Message contains far pointer to unknown segment.");
        }
        else {
          uVar6 = (ref->offsetAndKind).value;
          uVar14 = (ulong)(uVar6 >> 3);
          uVar13 = (segment_local->ptr).size_;
          if ((long)uVar13 < (long)uVar14) {
            uVar14 = uVar13;
          }
          pWVar19 = (WirePointer *)((segment_local->ptr).ptr + uVar14);
          if (segment_local == (SegmentReader *)0x0) {
            f.exception._0_1_ = 1;
LAB_00169221:
            if (((ref->offsetAndKind).value & 4) == 0) {
              pWVar1 = pWVar19 + 1;
              lVar7 = (long)((int)(pWVar19->offsetAndKind).value >> 2);
              if (segment_local == (SegmentReader *)0x0) {
                pWVar9 = pWVar1 + lVar7;
              }
              else {
                pwVar3 = (segment_local->ptr).ptr;
                pWVar9 = (WirePointer *)(pwVar3 + (segment_local->ptr).size_);
                if (((long)pwVar3 - (long)pWVar1 >> 3 <= lVar7) &&
                   (lVar7 <= (long)pWVar9 - (long)pWVar1 >> 3)) {
                  pWVar9 = pWVar1 + lVar7;
                }
              }
              goto LAB_001693ee;
            }
            iVar4 = (*segment_local->arena->_vptr_Arena[2])
                              (segment_local->arena,(ulong)(pWVar19->field_1).upper32Bits);
            f.exception = (Exception *)CONCAT44(extraout_var_00,iVar4);
            _kjCondition.right = 0;
            _kjCondition._12_4_ = 0;
            _kjCondition.op.content.ptr = " != ";
            _kjCondition.op.content.size_ = 5;
            _kjCondition.result = f.exception != (Exception *)0x0;
            if (f.exception == (Exception *)0x0) {
              _kjCondition.left = (int *)&f;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                        (&f_3,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x25f,FAILED,"newSegment != nullptr",
                         "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                         (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)
                         &_kjCondition,
                         (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_001693db:
              pWVar9 = (WirePointer *)0x0;
              kj::_::Debug::Fault::~Fault(&f_3);
            }
            else {
              uVar6 = (pWVar19->offsetAndKind).value & 3;
              _kjCondition.left = (int *)CONCAT44(2,uVar6);
              _kjCondition._8_8_ = anon_var_dwarf_22597;
              _kjCondition.op.content.ptr = (char *)0x5;
              _kjCondition.op.content.size_ = (size_t)(uVar6 == 2);
              if (uVar6 != 2) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                          (&f_3,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                           "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                           (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                            *)&_kjCondition,
                           (char (*) [51])"Second word of double-far pad must be far pointer.");
                goto LAB_001693db;
              }
              pcVar12 = (char *)(ulong)((pWVar19->offsetAndKind).value >> 3);
              if ((long)(f.exception)->file < (long)pcVar12) {
                pcVar12 = (f.exception)->file;
              }
              pWVar9 = (WirePointer *)
                       (((f.exception)->ownFile).content.disposer + (long)pcVar12 * 8);
              segment_local = (SegmentReader *)f.exception;
            }
            pWVar19 = pWVar19 + 1;
            goto LAB_001693ee;
          }
          uVar17 = 2 - (ulong)((uVar6 & 4) == 0);
          if (uVar13 < uVar14 + uVar17) {
            f.exception = (Exception *)((ulong)f.exception._1_7_ << 8);
          }
          else {
            uVar13 = segment_local->readLimiter->limit;
            if (uVar13 < uVar17) {
              (*segment_local->arena->_vptr_Arena[3])();
            }
            else {
              segment_local->readLimiter->limit = uVar13 - uVar17;
            }
            f.exception._0_1_ = uVar17 <= uVar13;
            if (uVar17 <= uVar13) goto LAB_00169221;
          }
          pDVar10 = &_kjCondition;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                    ((Fault *)pDVar10,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                     "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&f,
                     (char (*) [318])
                     "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
        }
        kj::_::Debug::Fault::~Fault((Fault *)pDVar10);
        pWVar9 = (WirePointer *)0x0;
        pWVar19 = ref;
      }
LAB_001693ee:
      pDVar10 = (DebugComparison<int_&,_int> *)&f;
      pAVar18 = (Array<char> *)0x0;
      if (pWVar9 == (WirePointer *)0x0) goto LAB_001697bb;
      uVar6 = (pWVar19->offsetAndKind).value;
      switch(uVar6 & 3) {
      case 0:
        if (segment_local == (SegmentReader *)0x0) {
          f.exception._0_1_ = 1;
LAB_0016956f:
          uVar13 = (ulong)(pWVar19->field_1).structRef.dataSize.value;
          uVar14 = (ulong)(pWVar19->field_1).structRef.ptrCount.value;
          pAVar20 = (Array<char> *)(uVar14 + uVar13);
          pAVar18 = (Array<char> *)0x0;
          if (uVar14 != 0) {
            pWVar9 = pWVar9 + uVar13;
            pAVar18 = (Array<char> *)0x0;
            do {
              MVar22 = totalSize(segment_local,pWVar9,nestingLimit_local);
              pAVar20 = (Array<char> *)((long)&pAVar20->ptr + MVar22.wordCount);
              pAVar18 = (Array<char> *)(ulong)((int)pAVar18 + MVar22.capCount);
              pWVar9 = pWVar9 + 1;
              uVar14 = uVar14 - 1;
            } while (uVar14 != 0);
          }
          goto LAB_001697be;
        }
        uVar13 = (ulong)(pWVar19->field_1).structRef.dataSize.value +
                 (ulong)(pWVar19->field_1).structRef.ptrCount.value;
        if ((segment_local->ptr).size_ <
            ((long)pWVar9 - (long)(segment_local->ptr).ptr >> 3) + uVar13) {
          f.exception = f.exception & 0xffffffffffffff00;
        }
        else {
          uVar14 = segment_local->readLimiter->limit;
          if (uVar14 < uVar13) {
            (*segment_local->arena->_vptr_Arena[3])();
          }
          else {
            segment_local->readLimiter->limit = uVar14 - uVar13;
          }
          f.exception._0_1_ = uVar13 <= uVar14;
          if (uVar13 <= uVar14) goto LAB_0016956f;
        }
        this = &_kjCondition;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[322]>
                  ((Fault *)this,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x322,FAILED,"boundsCheck(segment, ptr, ref->structRef.wordSize())",
                   "_kjCondition,\"Message contained out-of-bounds struct pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&f,
                   (char (*) [322])
                   "Message contained out-of-bounds struct pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
        break;
      case 1:
        uVar6 = (pWVar19->field_1).upper32Bits;
        pAVar20 = (Array<char> *)(ulong)(uVar6 & 7);
        switch(uVar6 & 7) {
        case 0:
          pAVar18 = pAVar20;
          goto LAB_001697be;
        default:
          pAVar20 = (Array<char> *)
                    ((ulong)(uint)(&BITS_PER_ELEMENT_TABLE)[(long)pAVar20] * (ulong)(uVar6 >> 3) +
                     0x3f >> 6);
          if (segment_local == (SegmentReader *)0x0) goto LAB_001697be;
          uVar13 = (ulong)pAVar20 & 0xffffffff;
          if ((segment_local->ptr).size_ <
              ((long)pWVar9 - (long)(segment_local->ptr).ptr >> 3) + uVar13) {
            f.exception = (Exception *)((ulong)f.exception._1_7_ << 8);
          }
          else {
            uVar14 = segment_local->readLimiter->limit;
            if (uVar14 < uVar13) {
              (*segment_local->arena->_vptr_Arena[3])();
            }
            else {
              segment_local->readLimiter->limit = uVar14 - uVar13;
            }
            f.exception._0_1_ = uVar13 <= uVar14;
            if (uVar13 <= uVar14) goto LAB_001697be;
          }
          pcVar12 = "boundsCheck(segment, ptr, totalWords)";
          iVar4 = 0x33d;
          break;
        case 6:
          uVar13 = (ulong)(uVar6 >> 3);
          if (segment_local == (SegmentReader *)0x0) {
            f.exception._0_1_ = 1;
LAB_001697f5:
            pAVar15 = (Array<char> *)(ulong)(uVar6 >> 3);
            pAVar20 = pAVar15;
            if (7 < uVar6) {
              pAVar18 = (Array<char> *)0x0;
              do {
                MVar22 = totalSize(segment_local,pWVar9,nestingLimit_local);
                pAVar20 = (Array<char> *)((long)&pAVar20->ptr + MVar22.wordCount);
                pAVar18 = (Array<char> *)(ulong)((int)pAVar18 + MVar22.capCount);
                pWVar9 = pWVar9 + 1;
                pAVar15 = (Array<char> *)((long)&pAVar15[0xffffffffffffffff].disposer + 7);
              } while (pAVar15 != (Array<char> *)0x0);
            }
            goto LAB_001697be;
          }
          if ((segment_local->ptr).size_ <
              ((long)pWVar9 - (long)(segment_local->ptr).ptr >> 3) + uVar13) {
            f.exception = (Exception *)((ulong)f.exception._1_7_ << 8);
          }
          else {
            uVar14 = segment_local->readLimiter->limit;
            if (uVar14 < uVar13) {
              (*segment_local->arena->_vptr_Arena[3])();
            }
            else {
              segment_local->readLimiter->limit = uVar14 - uVar13;
            }
            f.exception._0_1_ = uVar13 <= uVar14;
            if (uVar13 <= uVar14) goto LAB_001697f5;
          }
          pcVar12 = "boundsCheck(segment, ptr, count * WORDS_PER_POINTER)";
          iVar4 = 0x348;
          break;
        case 7:
          wordCount = uVar6 >> 3;
          if (segment_local == (SegmentReader *)0x0) {
            f.exception._0_1_ = 1;
LAB_0016970a:
            uVar6 = (pWVar9->offsetAndKind).value & 3;
            _kjCondition.left = (int *)(ulong)uVar6;
            _kjCondition._8_8_ = anon_var_dwarf_22597;
            _kjCondition.op.content.ptr = (char *)0x5;
            _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar6 == 0)
            ;
            if (uVar6 == 0) {
              uVar6 = (pWVar9->offsetAndKind).value >> 2 & 0x1fffffff;
              f.exception = (Exception *)
                            (((ulong)(pWVar9->field_1).structRef.ptrCount.value +
                             (ulong)(pWVar9->field_1).structRef.dataSize.value) * (ulong)uVar6);
              _kjCondition._8_8_ = &wordCount;
              pEVar8 = (Exception *)(ulong)wordCount;
              _kjCondition.op.content.ptr = " <= ";
              _kjCondition.op.content.size_ = 5;
              bVar21 = (long)f.exception - (long)pEVar8 == 0;
              _kjCondition.result = f.exception < pEVar8 || bVar21;
              if (f.exception < pEVar8 || bVar21) {
                pAVar20 = (Array<char> *)((long)&((f.exception)->ownFile).content.ptr + 1);
                uVar5 = (uint)(pWVar9->field_1).structRef.ptrCount.value;
                pAVar18 = (Array<char> *)0x0;
                if ((uVar5 != 0) && (pAVar18 = (Array<char> *)0x0, uVar6 != 0)) {
                  uVar2 = (pWVar9->field_1).structRef.dataSize.value;
                  pAVar18 = (Array<char> *)0x0;
                  uVar11 = 0;
                  _kjCondition.left = (int *)&f;
                  do {
                    pWVar9 = pWVar9 + uVar2;
                    uVar16 = uVar5;
                    do {
                      pWVar9 = pWVar9 + 1;
                      MVar22 = totalSize(segment_local,pWVar9,nestingLimit_local);
                      pAVar20 = (Array<char> *)((long)&pAVar20->ptr + MVar22.wordCount);
                      pAVar18 = (Array<char> *)(ulong)((int)pAVar18 + MVar22.capCount);
                      uVar16 = uVar16 - 1;
                    } while (uVar16 != 0);
                    uVar11 = uVar11 + 1;
                  } while (uVar11 != uVar6);
                }
                goto LAB_001697be;
              }
              this = (DebugComparison<int_&,_int> *)&f_3;
              _kjCondition.left = (int *)&f;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_int&>&,char_const(&)[319]>
                        ((Fault *)this,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x368,FAILED,"actualSize <= wordCount",
                         "_kjCondition,\"Struct list pointer\'s elements overran size. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                         ,(DebugComparison<unsigned_long_&,_unsigned_int_&> *)&_kjCondition,
                         (char (*) [319])
                         "Struct list pointer\'s elements overran size. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                        );
              goto LAB_00169655;
            }
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[54]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x360,FAILED,"elementTag->kind() == WirePointer::STRUCT",
                       "_kjCondition,\"Don\'t know how to handle non-STRUCT inline composite.\"",
                       (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                       &_kjCondition,
                       (char (*) [54])"Don\'t know how to handle non-STRUCT inline composite.");
          }
          else {
            if ((segment_local->ptr).size_ <
                ((long)pWVar9 - (long)(segment_local->ptr).ptr >> 3) + (ulong)wordCount + 1) {
              f.exception = (Exception *)((ulong)f.exception._1_7_ << 8);
            }
            else {
              uVar14 = (ulong)wordCount + 1;
              uVar13 = segment_local->readLimiter->limit;
              if (uVar13 < uVar14) {
                (*segment_local->arena->_vptr_Arena[3])();
              }
              else {
                segment_local->readLimiter->limit = uVar13 - uVar14;
              }
              f.exception._0_1_ = uVar14 <= uVar13;
              if (uVar14 <= uVar13) goto LAB_0016970a;
            }
            pDVar10 = &_kjCondition;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                      ((Fault *)pDVar10,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x358,FAILED,"boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                       "_kjCondition,\"Message contained out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)&f,
                       (char (*) [320])
                       "Message contained out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
          }
          kj::_::Debug::Fault::~Fault((Fault *)pDVar10);
          goto LAB_001697bb;
        }
        this = &_kjCondition;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                  ((Fault *)this,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,iVar4,FAILED,pcVar12,
                   "_kjCondition,\"Message contained out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&f,
                   (char (*) [320])
                   "Message contained out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
        break;
      case 2:
        this = &_kjCondition;
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                  ((Fault *)this,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x385,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                   (char (*) [24])"Unexpected FAR pointer.");
        break;
      case 3:
        pAVar20 = (Array<char> *)(undefined1 *)0x0;
        if (uVar6 == 3) {
          pAVar18 = (Array<char> *)0x1;
        }
        else {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x38d,FAILED,(char *)0x0,"\"Unknown pointer type.\"",
                     (char (*) [22])"Unknown pointer type.");
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          pAVar18 = (Array<char> *)0x0;
        }
        goto LAB_001697be;
      }
    }
LAB_00169655:
    kj::_::Debug::Fault::~Fault((Fault *)this);
  }
LAB_001697bb:
  pAVar18 = (Array<char> *)0x0;
  pAVar20 = (Array<char> *)(undefined1 *)0x0;
LAB_001697be:
  MVar22._8_8_ = pAVar18;
  MVar22.wordCount = (WordCountN<61,_uint64_t>)pAVar20;
  return MVar22;
}

Assistant:

static MessageSizeCounts totalSize(
      SegmentReader* segment, const WirePointer* ref, int nestingLimit) {
    // Compute the total size of the object pointed to, not counting far pointer overhead.

    MessageSizeCounts result = { ZERO * WORDS, 0 };

    if (ref->isNull()) {
      return result;
    }

    KJ_REQUIRE(nestingLimit > 0, "Message is too deeply-nested.") {
      return result;
    }
    --nestingLimit;

    const word* ptr;
    KJ_IF_SOME(p, followFars(ref, ref->target(segment), segment)) {
      ptr = &p;
    } else {
      return result;
    }

    switch (ref->kind()) {
      case WirePointer::STRUCT: {
        KJ_REQUIRE(boundsCheck(segment, ptr, ref->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer. "
                   OUT_OF_BOUNDS_ERROR_DETAIL) {
          return result;
        }
        result.addWords(ref->structRef.wordSize());

        const WirePointer* pointerSection =
            reinterpret_cast<const WirePointer*>(ptr + ref->structRef.dataSize.get());
        for (auto i: kj::zeroTo(ref->structRef.ptrCount.get())) {
          result += totalSize(segment, pointerSection + i, nestingLimit);
        }
        break;
      }
      case WirePointer::LIST: {
        switch (ref->listRef.elementSize()) {
          case ElementSize::VOID:
            // Nothing.
            break;
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto totalWords = roundBitsUpToWords(
                upgradeBound<uint64_t>(ref->listRef.elementCount()) *
                dataBitsPerElement(ref->listRef.elementSize()));
            KJ_REQUIRE(boundsCheck(segment, ptr, totalWords),
                       "Message contained out-of-bounds list pointer. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }
            result.addWords(totalWords);
            break;
          }
          case ElementSize::POINTER: {
            auto count = ref->listRef.elementCount() * (POINTERS / ELEMENTS);

            KJ_REQUIRE(boundsCheck(segment, ptr, count * WORDS_PER_POINTER),
                       "Message contained out-of-bounds list pointer. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }

            result.addWords(count * WORDS_PER_POINTER);

            for (auto i: kj::zeroTo(count)) {
              result += totalSize(segment, reinterpret_cast<const WirePointer*>(ptr) + i,
                                  nestingLimit);
            }
            break;
          }
          case ElementSize::INLINE_COMPOSITE: {
            auto wordCount = ref->listRef.inlineCompositeWordCount();
            KJ_REQUIRE(boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                       "Message contained out-of-bounds list pointer. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }

            const WirePointer* elementTag = reinterpret_cast<const WirePointer*>(ptr);
            auto count = elementTag->inlineCompositeListElementCount();

            KJ_REQUIRE(elementTag->kind() == WirePointer::STRUCT,
                       "Don't know how to handle non-STRUCT inline composite.") {
              return result;
            }

            auto actualSize = elementTag->structRef.wordSize() / ELEMENTS *
                              upgradeBound<uint64_t>(count);
            KJ_REQUIRE(actualSize <= wordCount,
                       "Struct list pointer's elements overran size. "
                       OUT_OF_BOUNDS_ERROR_DETAIL) {
              return result;
            }

            // We count the actual size rather than the claimed word count because that's what
            // we'll end up with if we make a copy.
            result.addWords(actualSize + POINTER_SIZE_IN_WORDS);

            WordCount dataSize = elementTag->structRef.dataSize.get();
            WirePointerCount pointerCount = elementTag->structRef.ptrCount.get();

            if (pointerCount > ZERO * POINTERS) {
              const word* pos = ptr + POINTER_SIZE_IN_WORDS;
              for (auto i KJ_UNUSED: kj::zeroTo(count)) {
                pos += dataSize;

                for (auto j KJ_UNUSED: kj::zeroTo(pointerCount)) {
                  result += totalSize(segment, reinterpret_cast<const WirePointer*>(pos),
                                      nestingLimit);
                  pos += POINTER_SIZE_IN_WORDS;
                }
              }
            }
            break;
          }
        }
        break;
      }
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          break;
        }
        break;
      case WirePointer::OTHER:
        if (ref->isCapability()) {
          result.capCount++;
        } else {
          KJ_FAIL_REQUIRE("Unknown pointer type.") { break; }
        }
        break;
    }

    return result;
  }